

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-val.c
# Opt level: O1

void borg_init_item_val(void)

{
  wchar_t wVar1;
  
  wVar1 = tval_find_idx("food");
  sv_food_apple = borg_lookup_sval_fail(wVar1,"Apple");
  sv_food_ration = borg_lookup_sval_fail(wVar1,"Ration of Food");
  sv_food_slime_mold = borg_lookup_sval_fail(wVar1,"Slime Mold");
  sv_food_draught = borg_lookup_sval_fail(wVar1,"Draught of the Ents");
  sv_food_pint = borg_lookup_sval_fail(wVar1,"Pint of Fine Wine");
  sv_food_sip = borg_lookup_sval_fail(wVar1,"Sip of Miruvor");
  sv_food_waybread = borg_lookup_sval_fail(wVar1,"Piece of Elvish Waybread");
  sv_food_honey_cake = borg_lookup_sval_fail(wVar1,"Honey-cake");
  sv_food_slice = borg_lookup_sval_fail(wVar1,"Slice of Meat");
  sv_food_handful = borg_lookup_sval_fail(wVar1,"Handful of Dried Fruits");
  wVar1 = tval_find_idx("mushroom");
  sv_mush_second_sight = borg_lookup_sval_fail(wVar1,"Second Sight");
  sv_mush_fast_recovery = borg_lookup_sval_fail(wVar1,"Fast Recovery");
  sv_mush_restoring = borg_lookup_sval_fail(wVar1,"Vigor");
  sv_mush_mana = borg_lookup_sval_fail(wVar1,"Clear Mind");
  sv_mush_emergency = borg_lookup_sval_fail(wVar1,"Emergency");
  sv_mush_terror = borg_lookup_sval_fail(wVar1,"Terror");
  sv_mush_stoneskin = borg_lookup_sval_fail(wVar1,"Stoneskin");
  kv_mush_stoneskin = borg_lookup_kind(wVar1,sv_mush_stoneskin);
  sv_mush_debility = borg_lookup_sval_fail(wVar1,"Debility");
  sv_mush_sprinting = borg_lookup_sval_fail(wVar1,"Sprinting");
  sv_mush_cure_mind = borg_lookup_sval_fail(wVar1,"Clear Mind");
  sv_mush_purging = borg_lookup_sval_fail(wVar1,"Purging");
  wVar1 = tval_find_idx("light");
  sv_light_lantern = borg_lookup_sval_fail(wVar1,"Lantern");
  sv_light_torch = borg_lookup_sval_fail(wVar1,"Wooden Torch");
  wVar1 = tval_find_idx("flask");
  sv_flask_oil = borg_lookup_sval_fail(wVar1,"Flask of Oil");
  kv_flask_oil = borg_lookup_kind(wVar1,sv_flask_oil);
  wVar1 = tval_find_idx("potion");
  sv_potion_cure_critical = borg_lookup_sval_fail(wVar1,"Cure Critical Wounds");
  sv_potion_cure_serious = borg_lookup_sval_fail(wVar1,"Cure Serious Wounds");
  sv_potion_cure_light = borg_lookup_sval_fail(wVar1,"Cure Light Wounds");
  sv_potion_healing = borg_lookup_sval_fail(wVar1,"Healing");
  kv_potion_healing = borg_lookup_kind(wVar1,sv_potion_healing);
  sv_potion_star_healing = borg_lookup_sval_fail(wVar1,"*Healing*");
  sv_potion_life = borg_lookup_sval_fail(wVar1,"Life");
  sv_potion_restore_mana = borg_lookup_sval_fail(wVar1,"Restore Mana");
  kv_potion_restore_mana = borg_lookup_kind(wVar1,sv_potion_restore_mana);
  sv_potion_cure_poison = borg_lookup_sval_fail(wVar1,"Neutralize Poison");
  sv_potion_resist_heat = borg_lookup_sval_fail(wVar1,"Resist Heat");
  sv_potion_resist_cold = borg_lookup_sval_fail(wVar1,"Resist Cold");
  sv_potion_resist_pois = borg_lookup_sval_fail(wVar1,"Resist Poison");
  sv_potion_inc_str = borg_lookup_sval_fail(wVar1,"Strength");
  sv_potion_inc_int = borg_lookup_sval_fail(wVar1,"Intelligence");
  sv_potion_inc_wis = borg_lookup_sval_fail(wVar1,"Wisdom");
  sv_potion_inc_dex = borg_lookup_sval_fail(wVar1,"Dexterity");
  sv_potion_inc_con = borg_lookup_sval_fail(wVar1,"Constitution");
  sv_potion_inc_all = borg_lookup_sval_fail(wVar1,"Augmentation");
  sv_potion_inc_str2 = borg_lookup_sval_fail(wVar1,"Brawn");
  sv_potion_inc_int2 = borg_lookup_sval_fail(wVar1,"Intellect");
  sv_potion_inc_wis2 = borg_lookup_sval_fail(wVar1,"Contemplation");
  sv_potion_inc_dex2 = borg_lookup_sval_fail(wVar1,"Nimbleness");
  sv_potion_inc_con2 = borg_lookup_sval_fail(wVar1,"Toughness");
  sv_potion_restore_life = borg_lookup_sval_fail(wVar1,"Restore Life Levels");
  sv_potion_speed = borg_lookup_sval_fail(wVar1,"Speed");
  sv_potion_berserk = borg_lookup_sval_fail(wVar1,"Berserk Strength");
  sv_potion_sleep = borg_lookup_sval_fail(wVar1,"Sleep");
  sv_potion_slowness = borg_lookup_sval_fail(wVar1,"Slowness");
  sv_potion_poison = borg_lookup_sval_fail(wVar1,"Poison");
  sv_potion_blindness = borg_lookup_sval_fail(wVar1,"Blindness");
  sv_potion_confusion = borg_lookup_sval_fail(wVar1,"Confusion");
  sv_potion_heroism = borg_lookup_sval_fail(wVar1,"Heroism");
  sv_potion_boldness = borg_lookup_sval_fail(wVar1,"Boldness");
  sv_potion_detect_invis = borg_lookup_sval_fail(wVar1,"True Seeing");
  sv_potion_enlightenment = borg_lookup_sval_fail(wVar1,"Enlightenment");
  sv_potion_slime_mold = borg_lookup_sval_fail(wVar1,"Slime Mold Juice");
  sv_potion_berserk = borg_lookup_sval_fail(wVar1,"Berserk Strength");
  sv_potion_infravision = borg_lookup_sval_fail(wVar1,"Infravision");
  sv_potion_inc_exp = borg_lookup_sval_fail(wVar1,"Experience");
  wVar1 = tval_find_idx("scroll");
  sv_scroll_identify = borg_lookup_sval_fail(wVar1,"Identify Rune");
  sv_scroll_phase_door = borg_lookup_sval_fail(wVar1,"Phase Door");
  sv_scroll_teleport = borg_lookup_sval_fail(wVar1,"Teleportation");
  sv_scroll_word_of_recall = borg_lookup_sval_fail(wVar1,"Word of Recall");
  sv_scroll_enchant_armor = borg_lookup_sval_fail(wVar1,"Enchant Armour");
  sv_scroll_enchant_weapon_to_hit = borg_lookup_sval_fail(wVar1,"Enchant Weapon To-Hit");
  sv_scroll_enchant_weapon_to_dam = borg_lookup_sval_fail(wVar1,"Enchant Weapon To-Dam");
  sv_scroll_star_enchant_armor = borg_lookup_sval_fail(wVar1,"*Enchant Armour*");
  sv_scroll_star_enchant_weapon = borg_lookup_sval_fail(wVar1,"*Enchant Weapon*");
  sv_scroll_protection_from_evil = borg_lookup_sval_fail(wVar1,"Protection from Evil");
  sv_scroll_rune_of_protection = borg_lookup_sval_fail(wVar1,"Rune of Protection");
  sv_scroll_teleport_level = borg_lookup_sval_fail(wVar1,"Teleport Level");
  sv_scroll_deep_descent = borg_lookup_sval_fail(wVar1,"Deep Descent");
  sv_scroll_recharging = borg_lookup_sval_fail(wVar1,"Recharging");
  sv_scroll_banishment = borg_lookup_sval_fail(wVar1,"Banishment");
  sv_scroll_mass_banishment = borg_lookup_sval_fail(wVar1,"Mass Banishment");
  kv_scroll_mass_banishment = borg_lookup_kind(wVar1,sv_scroll_mass_banishment);
  sv_scroll_blessing = borg_lookup_sval_fail(wVar1,"Blessing");
  sv_scroll_holy_chant = borg_lookup_sval_fail(wVar1,"Holy Chant");
  sv_scroll_holy_prayer = borg_lookup_sval_fail(wVar1,"Holy Prayer");
  sv_scroll_detect_invis = borg_lookup_sval_fail(wVar1,"Detect Invisible");
  sv_scroll_satisfy_hunger = borg_lookup_sval_fail(wVar1,"Remove Hunger");
  sv_scroll_light = borg_lookup_sval_fail(wVar1,"Light");
  sv_scroll_mapping = borg_lookup_sval_fail(wVar1,"Magic Mapping");
  sv_scroll_acquirement = borg_lookup_sval_fail(wVar1,"Acquirement");
  sv_scroll_star_acquirement = borg_lookup_sval_fail(wVar1,"*Acquirement*");
  sv_scroll_remove_curse = borg_lookup_sval_fail(wVar1,"Remove Curse");
  kv_scroll_remove_curse = borg_lookup_kind(wVar1,sv_scroll_remove_curse);
  sv_scroll_star_remove_curse = borg_lookup_sval_fail(wVar1,"*Remove Curse*");
  kv_scroll_star_remove_curse = borg_lookup_kind(wVar1,sv_scroll_star_remove_curse);
  sv_scroll_monster_confusion = borg_lookup_sval_fail(wVar1,"Monster Confusion");
  sv_scroll_trap_door_destruction = borg_lookup_sval_fail(wVar1,"Door Destruction");
  sv_scroll_dispel_undead = borg_lookup_sval_fail(wVar1,"Dispel Undead");
  wVar1 = tval_find_idx("ring");
  sv_ring_flames = borg_lookup_sval_fail(wVar1,"Flames");
  sv_ring_ice = borg_lookup_sval_fail(wVar1,"Ice");
  sv_ring_acid = borg_lookup_sval_fail(wVar1,"Acid");
  sv_ring_lightning = borg_lookup_sval_fail(wVar1,"Lightning");
  sv_ring_digging = borg_lookup_sval_fail(wVar1,"Digging");
  sv_ring_speed = borg_lookup_sval_fail(wVar1,"Speed");
  sv_ring_damage = borg_lookup_sval_fail(wVar1,"Damage");
  sv_ring_dog = borg_lookup_sval_fail(wVar1,"the Dog");
  wVar1 = tval_find_idx("amulet");
  sv_amulet_teleportation = borg_lookup_sval_fail(wVar1,"Teleportation");
  wVar1 = tval_find_idx("rod");
  sv_rod_recall = borg_lookup_sval_fail(wVar1,"Recall");
  kv_rod_recall = borg_lookup_kind(wVar1,sv_rod_recall);
  sv_rod_detection = borg_lookup_sval_fail(wVar1,"Detection");
  sv_rod_illumination = borg_lookup_sval_fail(wVar1,"Illumination");
  sv_rod_speed = borg_lookup_sval_fail(wVar1,"Speed");
  sv_rod_mapping = borg_lookup_sval_fail(wVar1,"Magic Mapping");
  sv_rod_healing = borg_lookup_sval_fail(wVar1,"Healing");
  kv_rod_healing = borg_lookup_kind(wVar1,sv_rod_healing);
  sv_rod_light = borg_lookup_sval_fail(wVar1,"Light");
  sv_rod_fire_bolt = borg_lookup_sval_fail(wVar1,"Fire Bolts");
  sv_rod_elec_bolt = borg_lookup_sval_fail(wVar1,"Lightning Bolts");
  sv_rod_cold_bolt = borg_lookup_sval_fail(wVar1,"Frost Bolts");
  sv_rod_acid_bolt = borg_lookup_sval_fail(wVar1,"Acid Bolts");
  sv_rod_drain_life = borg_lookup_sval_fail(wVar1,"Drain Life");
  sv_rod_fire_ball = borg_lookup_sval_fail(wVar1,"Fire Balls");
  sv_rod_elec_ball = borg_lookup_sval_fail(wVar1,"Lightning Balls");
  sv_rod_cold_ball = borg_lookup_sval_fail(wVar1,"Cold Balls");
  sv_rod_acid_ball = borg_lookup_sval_fail(wVar1,"Acid Balls");
  sv_rod_teleport_other = borg_lookup_sval_fail(wVar1,"Teleport Other");
  sv_rod_slow_monster = borg_lookup_sval_fail(wVar1,"Slow Monster");
  sv_rod_sleep_monster = borg_lookup_sval_fail(wVar1,"Hold Monster");
  sv_rod_curing = borg_lookup_sval_fail(wVar1,"Curing");
  wVar1 = tval_find_idx("staff");
  sv_staff_teleportation = borg_lookup_sval_fail(wVar1,"Teleportation");
  sv_staff_destruction = borg_lookup_sval_fail(wVar1,"*Destruction*");
  sv_staff_speed = borg_lookup_sval_fail(wVar1,"Speed");
  sv_staff_healing = borg_lookup_sval_fail(wVar1,"Healing");
  sv_staff_the_magi = borg_lookup_sval_fail(wVar1,"the Magi");
  sv_staff_power = borg_lookup_sval_fail(wVar1,"Power");
  sv_staff_holiness = borg_lookup_sval_fail(wVar1,"Holiness");
  kv_staff_holiness = borg_lookup_kind(wVar1,sv_staff_holiness);
  sv_staff_curing = borg_lookup_sval_fail(wVar1,"Curing");
  sv_staff_sleep_monsters = borg_lookup_sval_fail(wVar1,"Sleep Monsters");
  sv_staff_slow_monsters = borg_lookup_sval_fail(wVar1,"Slow Monsters");
  sv_staff_detect_invis = borg_lookup_sval_fail(wVar1,"Detect Invisible");
  sv_staff_detect_evil = borg_lookup_sval_fail(wVar1,"Detect Evil");
  sv_staff_dispel_evil = borg_lookup_sval_fail(wVar1,"Dispel Evil");
  sv_staff_banishment = borg_lookup_sval_fail(wVar1,"Banishment");
  sv_staff_light = borg_lookup_sval_fail(wVar1,"Light");
  sv_staff_mapping = borg_lookup_sval_fail(wVar1,"Mapping");
  sv_staff_remove_curse = borg_lookup_sval_fail(wVar1,"Remove Curse");
  wVar1 = tval_find_idx("wand");
  sv_wand_light = borg_lookup_sval_fail(wVar1,"Light");
  sv_wand_teleport_away = borg_lookup_sval_fail(wVar1,"Teleport Other");
  sv_wand_stinking_cloud = borg_lookup_sval_fail(wVar1,"Stinking Cloud");
  kv_wand_stinking_cloud = borg_lookup_kind(wVar1,sv_wand_stinking_cloud);
  sv_wand_magic_missile = borg_lookup_sval_fail(wVar1,"Magic Missile");
  kv_wand_magic_missile = borg_lookup_kind(wVar1,sv_wand_magic_missile);
  sv_wand_annihilation = borg_lookup_sval_fail(wVar1,"Annihilation");
  kv_wand_annihilation = borg_lookup_kind(wVar1,sv_wand_annihilation);
  sv_wand_stone_to_mud = borg_lookup_sval_fail(wVar1,"Stone to Mud");
  sv_wand_wonder = borg_lookup_sval_fail(wVar1,"Wonder");
  sv_wand_hold_monster = borg_lookup_sval_fail(wVar1,"Hold Monster");
  sv_wand_slow_monster = borg_lookup_sval_fail(wVar1,"Slow Monster");
  sv_wand_fear_monster = borg_lookup_sval_fail(wVar1,"Scare Monster");
  sv_wand_confuse_monster = borg_lookup_sval_fail(wVar1,"Scare Monster");
  sv_wand_fire_bolt = borg_lookup_sval_fail(wVar1,"Fire Bolts");
  sv_wand_cold_bolt = borg_lookup_sval_fail(wVar1,"Frost Bolts");
  sv_wand_acid_bolt = borg_lookup_sval_fail(wVar1,"Acid Bolts");
  sv_wand_elec_bolt = borg_lookup_sval_fail(wVar1,"Lightning Bolts");
  sv_wand_fire_ball = borg_lookup_sval_fail(wVar1,"Fire Balls");
  sv_wand_cold_ball = borg_lookup_sval_fail(wVar1,"Cold Balls");
  sv_wand_acid_ball = borg_lookup_sval_fail(wVar1,"Acid Balls");
  sv_wand_elec_ball = borg_lookup_sval_fail(wVar1,"Lightning Bolts");
  sv_wand_dragon_cold = borg_lookup_sval_fail(wVar1,"Dragon\'s Frost");
  sv_wand_dragon_fire = borg_lookup_sval_fail(wVar1,"Dragon\'s Flame");
  sv_wand_drain_life = borg_lookup_sval_fail(wVar1,"Drain Life");
  wVar1 = tval_find_idx("sword");
  sv_dagger = borg_lookup_sval_fail(wVar1,"Dagger");
  wVar1 = tval_find_idx("bow");
  sv_sling = borg_lookup_sval_fail(wVar1,"Sling");
  sv_short_bow = borg_lookup_sval_fail(wVar1,"Short Bow");
  sv_long_bow = borg_lookup_sval_fail(wVar1,"Long Bow");
  sv_light_xbow = borg_lookup_sval_fail(wVar1,"Light Crossbow");
  sv_heavy_xbow = borg_lookup_sval_fail(wVar1,"Heavy Crossbow");
  wVar1 = tval_find_idx("arrow");
  sv_arrow_seeker = borg_lookup_sval_fail(wVar1,"Seeker Arrow");
  sv_arrow_mithril = borg_lookup_sval_fail(wVar1,"Mithril Arrow");
  wVar1 = tval_find_idx("bolt");
  sv_bolt_seeker = borg_lookup_sval_fail(wVar1,"Seeker Bolt");
  sv_bolt_mithril = borg_lookup_sval_fail(wVar1,"Mithril Bolt");
  wVar1 = tval_find_idx("gloves");
  sv_set_of_leather_gloves = borg_lookup_sval_fail(wVar1,"Set of Leather Gloves");
  wVar1 = tval_find_idx("cloak");
  sv_cloak = borg_lookup_sval_fail(wVar1,"Cloak");
  wVar1 = tval_find_idx("soft armor");
  sv_robe = borg_lookup_sval_fail(wVar1,"Robe");
  wVar1 = tval_find_idx("crown");
  sv_iron_crown = borg_lookup_sval_fail(wVar1,"Iron Crown");
  wVar1 = tval_find_idx("dragon armor");
  sv_dragon_blue = borg_lookup_sval_fail(wVar1,"Blue Dragon Scale Mail");
  sv_dragon_black = borg_lookup_sval_fail(wVar1,"Black Dragon Scale Mail");
  sv_dragon_white = borg_lookup_sval_fail(wVar1,"White Dragon Scale Mail");
  sv_dragon_red = borg_lookup_sval_fail(wVar1,"Red Dragon Scale Mail");
  sv_dragon_green = borg_lookup_sval_fail(wVar1,"Green Dragon Scale Mail");
  sv_dragon_multihued = borg_lookup_sval_fail(wVar1,"Multi-Hued Dragon Scale Mail");
  sv_dragon_shining = borg_lookup_sval_fail(wVar1,"Shining Dragon Scale Mail");
  sv_dragon_law = borg_lookup_sval_fail(wVar1,"Law Dragon Scale Mail");
  sv_dragon_gold = borg_lookup_sval_fail(wVar1,"Gold Dragon Scale Mail");
  sv_dragon_chaos = borg_lookup_sval_fail(wVar1,"Chaos Dragon Scale Mail");
  sv_dragon_balance = borg_lookup_sval_fail(wVar1,"Balance Dragon Scale Mail");
  sv_dragon_power = borg_lookup_sval_fail(wVar1,"Power Dragon Scale Mail");
  return;
}

Assistant:

void borg_init_item_val(void)
{
    int tval           = tval_find_idx("food");
    sv_food_apple      = borg_lookup_sval_fail(tval, "Apple");
    sv_food_ration     = borg_lookup_sval_fail(tval, "Ration of Food");
    sv_food_slime_mold = borg_lookup_sval_fail(tval, "Slime Mold");
    sv_food_draught    = borg_lookup_sval_fail(tval, "Draught of the Ents");
    sv_food_pint       = borg_lookup_sval_fail(tval, "Pint of Fine Wine");
    sv_food_sip        = borg_lookup_sval_fail(tval, "Sip of Miruvor");
    sv_food_waybread = borg_lookup_sval_fail(tval, "Piece of Elvish Waybread");
    sv_food_honey_cake = borg_lookup_sval_fail(tval, "Honey-cake");
    sv_food_slice      = borg_lookup_sval_fail(tval, "Slice of Meat");
    sv_food_handful    = borg_lookup_sval_fail(tval, "Handful of Dried Fruits");

    tval               = tval_find_idx("mushroom");
    sv_mush_second_sight  = borg_lookup_sval_fail(tval, "Second Sight");
    sv_mush_fast_recovery = borg_lookup_sval_fail(tval, "Fast Recovery");
    sv_mush_restoring     = borg_lookup_sval_fail(tval, "Vigor");
    sv_mush_mana          = borg_lookup_sval_fail(tval, "Clear Mind");
    sv_mush_emergency     = borg_lookup_sval_fail(tval, "Emergency");
    sv_mush_terror        = borg_lookup_sval_fail(tval, "Terror");
    sv_mush_stoneskin     = borg_lookup_sval_fail(tval, "Stoneskin");
    kv_mush_stoneskin     = borg_lookup_kind(tval, sv_mush_stoneskin);
    sv_mush_debility      = borg_lookup_sval_fail(tval, "Debility");
    sv_mush_sprinting     = borg_lookup_sval_fail(tval, "Sprinting");
    sv_mush_cure_mind     = borg_lookup_sval_fail(tval, "Clear Mind");
    sv_mush_purging       = borg_lookup_sval_fail(tval, "Purging");

    tval                  = tval_find_idx("light");
    sv_light_lantern      = borg_lookup_sval_fail(tval, "Lantern");
    sv_light_torch        = borg_lookup_sval_fail(tval, "Wooden Torch");

    tval                  = tval_find_idx("flask");
    sv_flask_oil          = borg_lookup_sval_fail(tval, "Flask of Oil");
    kv_flask_oil          = borg_lookup_kind(tval, sv_flask_oil);

    tval                  = tval_find_idx("potion");
    sv_potion_cure_critical
        = borg_lookup_sval_fail(tval, "Cure Critical Wounds");
    sv_potion_cure_serious = borg_lookup_sval_fail(tval, "Cure Serious Wounds");
    sv_potion_cure_light   = borg_lookup_sval_fail(tval, "Cure Light Wounds");
    sv_potion_healing      = borg_lookup_sval_fail(tval, "Healing");
    kv_potion_healing      = borg_lookup_kind(tval, sv_potion_healing);
    sv_potion_star_healing = borg_lookup_sval_fail(tval, "*Healing*");
    sv_potion_life         = borg_lookup_sval_fail(tval, "Life");
    sv_potion_restore_mana = borg_lookup_sval_fail(tval, "Restore Mana");
    kv_potion_restore_mana = borg_lookup_kind(tval, sv_potion_restore_mana);
    sv_potion_cure_poison  = borg_lookup_sval_fail(tval, "Neutralize Poison");
    sv_potion_resist_heat  = borg_lookup_sval_fail(tval, "Resist Heat");
    sv_potion_resist_cold  = borg_lookup_sval_fail(tval, "Resist Cold");
    sv_potion_resist_pois  = borg_lookup_sval_fail(tval, "Resist Poison");
    sv_potion_inc_str      = borg_lookup_sval_fail(tval, "Strength");
    sv_potion_inc_int      = borg_lookup_sval_fail(tval, "Intelligence");
    sv_potion_inc_wis      = borg_lookup_sval_fail(tval, "Wisdom");
    sv_potion_inc_dex      = borg_lookup_sval_fail(tval, "Dexterity");
    sv_potion_inc_con      = borg_lookup_sval_fail(tval, "Constitution");
    sv_potion_inc_all      = borg_lookup_sval_fail(tval, "Augmentation");
    sv_potion_inc_str2     = borg_lookup_sval_fail(tval, "Brawn");
    sv_potion_inc_int2     = borg_lookup_sval_fail(tval, "Intellect");
    sv_potion_inc_wis2     = borg_lookup_sval_fail(tval, "Contemplation");
    sv_potion_inc_dex2     = borg_lookup_sval_fail(tval, "Nimbleness");
    sv_potion_inc_con2     = borg_lookup_sval_fail(tval, "Toughness");
    sv_potion_restore_life = borg_lookup_sval_fail(tval, "Restore Life Levels");
    sv_potion_speed        = borg_lookup_sval_fail(tval, "Speed");
    sv_potion_berserk      = borg_lookup_sval_fail(tval, "Berserk Strength");
    sv_potion_sleep        = borg_lookup_sval_fail(tval, "Sleep");
    sv_potion_slowness     = borg_lookup_sval_fail(tval, "Slowness");
    sv_potion_poison       = borg_lookup_sval_fail(tval, "Poison");
    sv_potion_blindness    = borg_lookup_sval_fail(tval, "Blindness");
    sv_potion_confusion    = borg_lookup_sval_fail(tval, "Confusion");
    sv_potion_heroism      = borg_lookup_sval_fail(tval, "Heroism");
    sv_potion_boldness     = borg_lookup_sval_fail(tval, "Boldness");
    sv_potion_detect_invis = borg_lookup_sval_fail(tval, "True Seeing");
    sv_potion_enlightenment  = borg_lookup_sval_fail(tval, "Enlightenment");
    sv_potion_slime_mold     = borg_lookup_sval_fail(tval, "Slime Mold Juice");
    sv_potion_berserk        = borg_lookup_sval_fail(tval, "Berserk Strength");
    sv_potion_infravision    = borg_lookup_sval_fail(tval, "Infravision");
    sv_potion_inc_exp        = borg_lookup_sval_fail(tval, "Experience");

    tval                     = tval_find_idx("scroll");
    sv_scroll_identify       = borg_lookup_sval_fail(tval, "Identify Rune");
    sv_scroll_phase_door     = borg_lookup_sval_fail(tval, "Phase Door");
    sv_scroll_teleport       = borg_lookup_sval_fail(tval, "Teleportation");
    sv_scroll_word_of_recall = borg_lookup_sval_fail(tval, "Word of Recall");
    sv_scroll_enchant_armor  = borg_lookup_sval_fail(tval, "Enchant Armour");
    sv_scroll_enchant_weapon_to_hit
        = borg_lookup_sval_fail(tval, "Enchant Weapon To-Hit");
    sv_scroll_enchant_weapon_to_dam
        = borg_lookup_sval_fail(tval, "Enchant Weapon To-Dam");
    sv_scroll_star_enchant_armor
        = borg_lookup_sval_fail(tval, "*Enchant Armour*");
    sv_scroll_star_enchant_weapon
        = borg_lookup_sval_fail(tval, "*Enchant Weapon*");
    sv_scroll_protection_from_evil
        = borg_lookup_sval_fail(tval, "Protection from Evil");
    sv_scroll_rune_of_protection
        = borg_lookup_sval_fail(tval, "Rune of Protection");
    sv_scroll_teleport_level  = borg_lookup_sval_fail(tval, "Teleport Level");
    sv_scroll_deep_descent    = borg_lookup_sval_fail(tval, "Deep Descent");
    sv_scroll_recharging      = borg_lookup_sval_fail(tval, "Recharging");
    sv_scroll_banishment      = borg_lookup_sval_fail(tval, "Banishment");
    sv_scroll_mass_banishment = borg_lookup_sval_fail(tval, "Mass Banishment");
    kv_scroll_mass_banishment
        = borg_lookup_kind(tval, sv_scroll_mass_banishment);
    sv_scroll_blessing       = borg_lookup_sval_fail(tval, "Blessing");
    sv_scroll_holy_chant     = borg_lookup_sval_fail(tval, "Holy Chant");
    sv_scroll_holy_prayer    = borg_lookup_sval_fail(tval, "Holy Prayer");
    sv_scroll_detect_invis   = borg_lookup_sval_fail(tval, "Detect Invisible");
    sv_scroll_satisfy_hunger = borg_lookup_sval_fail(tval, "Remove Hunger");
    sv_scroll_light          = borg_lookup_sval_fail(tval, "Light");
    sv_scroll_mapping        = borg_lookup_sval_fail(tval, "Magic Mapping");
    sv_scroll_acquirement    = borg_lookup_sval_fail(tval, "Acquirement");
    sv_scroll_star_acquirement = borg_lookup_sval_fail(tval, "*Acquirement*");
    sv_scroll_remove_curse     = borg_lookup_sval_fail(tval, "Remove Curse");
    kv_scroll_remove_curse     = borg_lookup_kind(tval, sv_scroll_remove_curse);
    sv_scroll_star_remove_curse = borg_lookup_sval_fail(tval, "*Remove Curse*");
    kv_scroll_star_remove_curse
        = borg_lookup_kind(tval, sv_scroll_star_remove_curse);
    sv_scroll_monster_confusion
        = borg_lookup_sval_fail(tval, "Monster Confusion");
    sv_scroll_trap_door_destruction
        = borg_lookup_sval_fail(tval, "Door Destruction");
    sv_scroll_dispel_undead = borg_lookup_sval_fail(tval, "Dispel Undead");

    tval                    = tval_find_idx("ring");
    sv_ring_flames          = borg_lookup_sval_fail(tval, "Flames");
    sv_ring_ice             = borg_lookup_sval_fail(tval, "Ice");
    sv_ring_acid            = borg_lookup_sval_fail(tval, "Acid");
    sv_ring_lightning       = borg_lookup_sval_fail(tval, "Lightning");
    sv_ring_digging         = borg_lookup_sval_fail(tval, "Digging");
    sv_ring_speed           = borg_lookup_sval_fail(tval, "Speed");
    sv_ring_damage          = borg_lookup_sval_fail(tval, "Damage");
    sv_ring_dog             = borg_lookup_sval_fail(tval, "the Dog");

    tval                    = tval_find_idx("amulet");
    sv_amulet_teleportation = borg_lookup_sval_fail(tval, "Teleportation");

    tval                    = tval_find_idx("rod");
    sv_rod_recall           = borg_lookup_sval_fail(tval, "Recall");
    kv_rod_recall           = borg_lookup_kind(tval, sv_rod_recall);
    sv_rod_detection        = borg_lookup_sval_fail(tval, "Detection");
    sv_rod_illumination     = borg_lookup_sval_fail(tval, "Illumination");
    sv_rod_speed            = borg_lookup_sval_fail(tval, "Speed");
    sv_rod_mapping          = borg_lookup_sval_fail(tval, "Magic Mapping");
    sv_rod_healing          = borg_lookup_sval_fail(tval, "Healing");
    kv_rod_healing          = borg_lookup_kind(tval, sv_rod_healing);
    sv_rod_light            = borg_lookup_sval_fail(tval, "Light");
    sv_rod_fire_bolt        = borg_lookup_sval_fail(tval, "Fire Bolts");
    sv_rod_elec_bolt        = borg_lookup_sval_fail(tval, "Lightning Bolts");
    sv_rod_cold_bolt        = borg_lookup_sval_fail(tval, "Frost Bolts");
    sv_rod_acid_bolt        = borg_lookup_sval_fail(tval, "Acid Bolts");
    sv_rod_drain_life       = borg_lookup_sval_fail(tval, "Drain Life");
    sv_rod_fire_ball        = borg_lookup_sval_fail(tval, "Fire Balls");
    sv_rod_elec_ball        = borg_lookup_sval_fail(tval, "Lightning Balls");
    sv_rod_cold_ball        = borg_lookup_sval_fail(tval, "Cold Balls");
    sv_rod_acid_ball        = borg_lookup_sval_fail(tval, "Acid Balls");
    sv_rod_teleport_other   = borg_lookup_sval_fail(tval, "Teleport Other");
    sv_rod_slow_monster     = borg_lookup_sval_fail(tval, "Slow Monster");
    sv_rod_sleep_monster    = borg_lookup_sval_fail(tval, "Hold Monster");
    sv_rod_curing           = borg_lookup_sval_fail(tval, "Curing");

    tval                    = tval_find_idx("staff");
    sv_staff_teleportation  = borg_lookup_sval_fail(tval, "Teleportation");
    sv_staff_destruction    = borg_lookup_sval_fail(tval, "*Destruction*");
    sv_staff_speed          = borg_lookup_sval_fail(tval, "Speed");
    sv_staff_healing        = borg_lookup_sval_fail(tval, "Healing");
    sv_staff_the_magi       = borg_lookup_sval_fail(tval, "the Magi");
    sv_staff_power          = borg_lookup_sval_fail(tval, "Power");
    sv_staff_holiness       = borg_lookup_sval_fail(tval, "Holiness");
    kv_staff_holiness       = borg_lookup_kind(tval, sv_staff_holiness);
    sv_staff_curing         = borg_lookup_sval_fail(tval, "Curing");
    sv_staff_sleep_monsters = borg_lookup_sval_fail(tval, "Sleep Monsters");
    sv_staff_slow_monsters  = borg_lookup_sval_fail(tval, "Slow Monsters");
    sv_staff_detect_invis   = borg_lookup_sval_fail(tval, "Detect Invisible");
    sv_staff_detect_evil    = borg_lookup_sval_fail(tval, "Detect Evil");
    sv_staff_dispel_evil    = borg_lookup_sval_fail(tval, "Dispel Evil");
    sv_staff_banishment     = borg_lookup_sval_fail(tval, "Banishment");
    sv_staff_light          = borg_lookup_sval_fail(tval, "Light");
    sv_staff_mapping        = borg_lookup_sval_fail(tval, "Mapping");
    sv_staff_remove_curse   = borg_lookup_sval_fail(tval, "Remove Curse");

    tval                    = tval_find_idx("wand");
    sv_wand_light           = borg_lookup_sval_fail(tval, "Light");
    sv_wand_teleport_away   = borg_lookup_sval_fail(tval, "Teleport Other");
    sv_wand_stinking_cloud  = borg_lookup_sval_fail(tval, "Stinking Cloud");
    kv_wand_stinking_cloud  = borg_lookup_kind(tval, sv_wand_stinking_cloud);
    sv_wand_magic_missile   = borg_lookup_sval_fail(tval, "Magic Missile");
    kv_wand_magic_missile   = borg_lookup_kind(tval, sv_wand_magic_missile);
    sv_wand_annihilation    = borg_lookup_sval_fail(tval, "Annihilation");
    kv_wand_annihilation    = borg_lookup_kind(tval, sv_wand_annihilation);
    sv_wand_stone_to_mud    = borg_lookup_sval_fail(tval, "Stone to Mud");
    sv_wand_wonder          = borg_lookup_sval_fail(tval, "Wonder");
    sv_wand_hold_monster    = borg_lookup_sval_fail(tval, "Hold Monster");
    sv_wand_slow_monster    = borg_lookup_sval_fail(tval, "Slow Monster");
    sv_wand_fear_monster    = borg_lookup_sval_fail(tval, "Scare Monster");
    sv_wand_confuse_monster = borg_lookup_sval_fail(tval, "Scare Monster");
    sv_wand_fire_bolt       = borg_lookup_sval_fail(tval, "Fire Bolts");
    sv_wand_cold_bolt       = borg_lookup_sval_fail(tval, "Frost Bolts");
    sv_wand_acid_bolt       = borg_lookup_sval_fail(tval, "Acid Bolts");
    sv_wand_elec_bolt       = borg_lookup_sval_fail(tval, "Lightning Bolts");
    sv_wand_fire_ball       = borg_lookup_sval_fail(tval, "Fire Balls");
    sv_wand_cold_ball       = borg_lookup_sval_fail(tval, "Cold Balls");
    sv_wand_acid_ball       = borg_lookup_sval_fail(tval, "Acid Balls");
    sv_wand_elec_ball       = borg_lookup_sval_fail(tval, "Lightning Bolts");
    sv_wand_dragon_cold     = borg_lookup_sval_fail(tval, "Dragon's Frost");
    sv_wand_dragon_fire     = borg_lookup_sval_fail(tval, "Dragon's Flame");
    sv_wand_drain_life      = borg_lookup_sval_fail(tval, "Drain Life");

    tval                    = tval_find_idx("sword");
    sv_dagger               = borg_lookup_sval_fail(tval, "Dagger");

    tval                    = tval_find_idx("bow");
    sv_sling                = borg_lookup_sval_fail(tval, "Sling");
    sv_short_bow            = borg_lookup_sval_fail(tval, "Short Bow");
    sv_long_bow             = borg_lookup_sval_fail(tval, "Long Bow");
    sv_light_xbow           = borg_lookup_sval_fail(tval, "Light Crossbow");
    sv_heavy_xbow           = borg_lookup_sval_fail(tval, "Heavy Crossbow");

    tval                    = tval_find_idx("arrow");
    sv_arrow_seeker         = borg_lookup_sval_fail(tval, "Seeker Arrow");
    sv_arrow_mithril        = borg_lookup_sval_fail(tval, "Mithril Arrow");

    tval                    = tval_find_idx("bolt");
    sv_bolt_seeker          = borg_lookup_sval_fail(tval, "Seeker Bolt");
    sv_bolt_mithril         = borg_lookup_sval_fail(tval, "Mithril Bolt");

    tval                    = tval_find_idx("gloves");
    sv_set_of_leather_gloves
        = borg_lookup_sval_fail(tval, "Set of Leather Gloves");

    tval            = tval_find_idx("cloak");
    sv_cloak        = borg_lookup_sval_fail(tval, "Cloak");

    tval            = tval_find_idx("soft armor");
    sv_robe         = borg_lookup_sval_fail(tval, "Robe");

    tval            = tval_find_idx("crown");
    sv_iron_crown   = borg_lookup_sval_fail(tval, "Iron Crown");

    tval            = tval_find_idx("dragon armor");
    sv_dragon_blue  = borg_lookup_sval_fail(tval, "Blue Dragon Scale Mail");
    sv_dragon_black = borg_lookup_sval_fail(tval, "Black Dragon Scale Mail");
    sv_dragon_white = borg_lookup_sval_fail(tval, "White Dragon Scale Mail");
    sv_dragon_red   = borg_lookup_sval_fail(tval, "Red Dragon Scale Mail");
    sv_dragon_green = borg_lookup_sval_fail(tval, "Green Dragon Scale Mail");
    sv_dragon_multihued
        = borg_lookup_sval_fail(tval, "Multi-Hued Dragon Scale Mail");
    sv_dragon_shining
        = borg_lookup_sval_fail(tval, "Shining Dragon Scale Mail");
    sv_dragon_law   = borg_lookup_sval_fail(tval, "Law Dragon Scale Mail");
    sv_dragon_gold  = borg_lookup_sval_fail(tval, "Gold Dragon Scale Mail");
    sv_dragon_chaos = borg_lookup_sval_fail(tval, "Chaos Dragon Scale Mail");
    sv_dragon_balance
        = borg_lookup_sval_fail(tval, "Balance Dragon Scale Mail");
    sv_dragon_power = borg_lookup_sval_fail(tval, "Power Dragon Scale Mail");
}